

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall
ImGuiListClipper::ForceDisplayRangeByIndices(ImGuiListClipper *this,int item_min,int item_max)

{
  ImGuiListClipperRange local_10;
  
  if (item_min < item_max) {
    local_10.Max = item_max;
    local_10.Min = item_min;
    local_10.PosToIndexConvert = false;
    local_10.PosToIndexOffsetMin = '\0';
    local_10.PosToIndexOffsetMax = '\0';
    local_10._11_1_ = 0;
    ImVector<ImGuiListClipperRange>::push_back
              ((ImVector<ImGuiListClipperRange> *)((long)this->TempData + 0x18),&local_10);
  }
  return;
}

Assistant:

void ImGuiListClipper::ForceDisplayRangeByIndices(int item_min, int item_max)
{
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(DisplayStart < 0); // Only allowed after Begin() and if there has not been a specified range yet.
    IM_ASSERT(item_min <= item_max);
    if (item_min < item_max)
        data->Ranges.push_back(ImGuiListClipperRange::FromIndices(item_min, item_max));
}